

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O1

size_t ZSTD_ldm_generateSequences
                 (ldmState_t *ldmState,rawSeqStore_t *sequences,ldmParams_t *params,void *src,
                 size_t srcSize)

{
  BYTE **ppBVar1;
  U32 *pUVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong *puVar5;
  uint uVar6;
  U32 UVar7;
  uint uVar8;
  uint uVar9;
  U32 UVar10;
  ulong uVar11;
  BYTE *pBVar12;
  ldmEntry_t *plVar13;
  U64 UVar14;
  size_t sVar15;
  rawSeq *prVar16;
  undefined4 uVar17;
  ldmParams_t ldmParams;
  uint uVar18;
  ulong *puVar19;
  BYTE *pBVar20;
  U32 UVar21;
  uint uVar22;
  uint uVar23;
  U32 UVar24;
  ulong uVar25;
  ulong *puVar26;
  uint uVar27;
  int iVar28;
  long lVar29;
  ulong *puVar30;
  ulong uVar31;
  ldmEntry_t *plVar32;
  ulong *unaff_RBX;
  ulong *puVar33;
  ulong *puVar34;
  ulong *puVar35;
  ulong *puVar36;
  U32 hBits;
  bool bVar37;
  uint uVar38;
  ulong *puVar39;
  byte *pbVar40;
  BYTE *pBVar41;
  ulong uVar42;
  long lVar43;
  U32 u;
  long lVar44;
  byte *pbVar45;
  byte *pbVar46;
  ulong *puVar47;
  ulong uVar48;
  BYTE *istart;
  ulong *puVar49;
  ulong *puVar50;
  ulong *puVar51;
  ulong *local_1d8;
  int iStack_16c;
  ulong local_160;
  ldmEntry_t *local_158;
  byte *local_140;
  byte *local_110;
  ulong *local_f8;
  byte *local_f0;
  size_t local_e0;
  
  uVar22 = 1 << ((byte)params->windowLog & 0x1f);
  lVar29 = (ulong)((srcSize & 0xfffff) != 0) + (srcSize >> 0x14);
  if (lVar29 != 0) {
    lVar43 = 0;
    local_160 = 0;
    do {
      puVar49 = (ulong *)0x0;
      uVar11 = sequences->size;
      if (sequences->capacity <= uVar11) {
        return 0;
      }
      puVar4 = (ulong *)((long)src + lVar43 * 0x100000);
      puVar47 = puVar4 + 0x20000;
      if (srcSize + lVar43 * -0x100000 < 0x100000) {
        puVar47 = (ulong *)((long)src + srcSize);
      }
      pBVar12 = (ldmState->window).base;
      iVar28 = (int)pBVar12;
      if (0xe0000000 < (uint)((int)puVar47 - iVar28)) {
        UVar21 = params->hashLog;
        uVar27 = ((int)src - iVar28) - uVar22;
        (ldmState->window).base = pBVar12 + uVar27;
        ppBVar1 = &(ldmState->window).dictBase;
        *ppBVar1 = *ppBVar1 + uVar27;
        pUVar2 = &(ldmState->window).lowLimit;
        *pUVar2 = *pUVar2 - uVar27;
        pUVar2 = &(ldmState->window).dictLimit;
        *pUVar2 = *pUVar2 - uVar27;
        plVar13 = ldmState->hashTable;
        lVar44 = 0;
        do {
          uVar23 = plVar13[lVar44].offset;
          unaff_RBX = (ulong *)(ulong)(uVar23 - uVar27);
          if (uVar23 < uVar27) {
            unaff_RBX = puVar49;
          }
          plVar13[lVar44].offset = (U32)unaff_RBX;
          lVar44 = lVar44 + 1;
        } while (1L << ((byte)UVar21 & 0x3f) != lVar44);
      }
      pBVar12 = (ldmState->window).base;
      iVar28 = (int)pBVar12;
      uVar27 = (int)puVar47 - iVar28;
      uVar23 = uVar27 - uVar22;
      if (uVar22 <= uVar27 && uVar23 != 0) {
        if ((ldmState->window).lowLimit < uVar23) {
          (ldmState->window).lowLimit = uVar23;
        }
        uVar27 = (ldmState->window).lowLimit;
        if ((ldmState->window).dictLimit < uVar27) {
          (ldmState->window).dictLimit = uVar27;
        }
      }
      UVar21 = params->bucketSizeLog;
      uVar27 = (ldmState->window).dictLimit;
      uVar23 = params->hashRateLog;
      uVar6 = (ldmState->window).lowLimit;
      UVar7 = params->hashLog;
      uVar8 = params->minMatchLength;
      pbVar40 = (byte *)(ulong)uVar8;
      UVar14 = ldmState->hashPower;
      if (uVar6 < uVar27) {
        pBVar41 = (ldmState->window).dictBase;
        uVar18 = uVar6;
      }
      else {
        pBVar41 = (BYTE *)0x0;
        uVar18 = uVar27;
      }
      puVar33 = (ulong *)(pBVar41 + uVar27);
      puVar19 = (ulong *)(pBVar41 + uVar18);
      if (uVar27 <= uVar6) {
        puVar33 = puVar49;
        puVar19 = puVar49;
      }
      pbVar45 = (byte *)0x8;
      if (8 < uVar8) {
        pbVar45 = pbVar40;
      }
      puVar30 = (ulong *)(((long)puVar47 - (long)puVar4) + (long)puVar4);
      puVar36 = (ulong *)((long)puVar30 - (long)pbVar45);
      local_1d8 = puVar4;
      if (puVar4 <= puVar36) {
        hBits = UVar7 - UVar21;
        puVar5 = (ulong *)(pBVar12 + uVar27);
        uVar38 = 0x20 - hBits;
        puVar3 = (ulong *)((long)puVar30 - 7);
        puVar39 = (ulong *)(ulong)(uVar38 - uVar23);
        if (uVar38 < uVar23) {
          puVar39 = puVar49;
        }
        uVar48 = 0;
        puVar26 = (ulong *)0x0;
        puVar49 = puVar4;
        do {
          if (puVar49 == puVar4) {
            if (uVar8 == 0) {
              uVar48 = 0;
            }
            else {
              pbVar45 = (byte *)0x0;
              uVar48 = 0;
              do {
                uVar48 = uVar48 * -0x30e44323485a9b9d +
                         (ulong)*(byte *)((long)puVar49 + (long)pbVar45) + 10;
                pbVar45 = pbVar45 + 1;
              } while (pbVar40 != pbVar45);
            }
          }
          else {
            uVar48 = (uVar48 - ((ulong)(byte)*puVar26 + 10) * UVar14) * -0x30e44323485a9b9d +
                     (ulong)*(byte *)((long)puVar26 + (long)pbVar40) + 10;
          }
          if (((uint)(uVar48 >> ((byte)puVar39 & 0x3f)) | -1 << ((byte)uVar23 & 0x1f)) == 0xffffffff
             ) {
            UVar24 = (int)puVar49 - iVar28;
            uVar31 = uVar48 >> (0x40U - (char)hBits & 0x3f) & 0xffffffff;
            if (UVar7 == UVar21) {
              uVar31 = 0;
            }
            plVar32 = ldmState->hashTable + (uVar31 << ((byte)params->bucketSizeLog & 0x3f));
            plVar13 = plVar32 + (1L << ((byte)UVar21 & 0x3f));
            local_110 = (byte *)0x0;
            local_f8 = (ulong *)0x0;
            local_158 = (ldmEntry_t *)0x0;
            local_f0 = (byte *)0x0;
            do {
              if (plVar32->checksum == (U32)(uVar48 >> ((byte)uVar38 & 0x3f))) {
                uVar9 = plVar32->offset;
                if (uVar18 < uVar9) {
                  if (uVar6 < uVar27) {
                    puVar26 = puVar30;
                    pBVar20 = pBVar12;
                    if (uVar9 < uVar27) {
                      puVar26 = puVar33;
                      pBVar20 = pBVar41;
                    }
                    puVar35 = (ulong *)(pBVar20 + uVar9);
                    puVar50 = (ulong *)(((long)puVar26 - (long)puVar35) + (long)puVar49);
                    if (puVar47 <= puVar50) {
                      puVar50 = puVar30;
                    }
                    puVar34 = puVar35;
                    puVar51 = puVar49;
                    if (puVar49 < (ulong *)((long)puVar50 - 7U)) {
                      uVar42 = *puVar49 ^ *puVar35;
                      uVar31 = 0;
                      if (uVar42 != 0) {
                        for (; (uVar42 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                        }
                      }
                      pbVar45 = (byte *)(uVar31 >> 3 & 0x1fffffff);
                      puVar51 = puVar49 + 1;
                      if (*puVar35 == *puVar49) {
                        do {
                          puVar34 = puVar34 + 1;
                          if ((ulong *)((long)puVar50 - 7U) <= puVar51) goto LAB_004344a5;
                          uVar31 = *puVar51;
                          uVar25 = uVar31 ^ *puVar34;
                          uVar42 = 0;
                          if (uVar25 != 0) {
                            for (; (uVar25 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                            }
                          }
                          pbVar45 = (byte *)((long)puVar51 +
                                            ((uVar42 >> 3 & 0x1fffffff) - (long)puVar49));
                          puVar51 = puVar51 + 1;
                        } while (*puVar34 == uVar31);
                      }
                    }
                    else {
LAB_004344a5:
                      if ((puVar51 < (ulong *)((long)puVar50 - 3U)) &&
                         ((int)*puVar34 == (int)*puVar51)) {
                        puVar51 = (ulong *)((long)puVar51 + 4);
                        puVar34 = (ulong *)((long)puVar34 + 4);
                      }
                      if ((puVar51 < (ulong *)((long)puVar50 - 1U)) &&
                         ((short)*puVar34 == (short)*puVar51)) {
                        puVar51 = (ulong *)((long)puVar51 + 2);
                        puVar34 = (ulong *)((long)puVar34 + 2);
                      }
                      if (puVar51 < puVar50) {
                        puVar51 = (ulong *)((long)puVar51 +
                                           (ulong)((byte)*puVar34 == (byte)*puVar51));
                      }
                      pbVar45 = (byte *)((long)puVar51 - (long)puVar49);
                    }
                    if ((ulong *)((long)puVar35 + (long)pbVar45) == puVar26) {
                      puVar26 = (ulong *)(pbVar45 + (long)puVar49);
                      puVar34 = puVar5;
                      puVar50 = puVar26;
                      if (puVar26 < puVar3) {
                        uVar42 = *puVar26 ^ *puVar5;
                        uVar31 = 0;
                        if (uVar42 != 0) {
                          for (; (uVar42 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                          }
                        }
                        pbVar46 = (byte *)(uVar31 >> 3 & 0x1fffffff);
                        if (*puVar5 == *puVar26) {
                          do {
                            puVar34 = puVar34 + 1;
                            puVar50 = puVar50 + 1;
                            if (puVar3 <= puVar50) goto LAB_00434644;
                            uVar42 = *puVar50 ^ *puVar34;
                            uVar31 = 0;
                            if (uVar42 != 0) {
                              for (; (uVar42 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                              }
                            }
                            pbVar46 = (byte *)((long)puVar50 +
                                              ((uVar31 >> 3 & 0x1fffffff) - (long)puVar26));
                          } while (*puVar34 == *puVar50);
                        }
                      }
                      else {
LAB_00434644:
                        if ((puVar50 < (ulong *)((long)puVar30 - 3U)) &&
                           ((int)*puVar34 == (int)*puVar50)) {
                          puVar50 = (ulong *)((long)puVar50 + 4);
                          puVar34 = (ulong *)((long)puVar34 + 4);
                        }
                        if ((puVar50 < (ulong *)((long)puVar30 + -1)) &&
                           ((short)*puVar34 == (short)*puVar50)) {
                          puVar50 = (ulong *)((long)puVar50 + 2);
                          puVar34 = (ulong *)((long)puVar34 + 2);
                        }
                        if (puVar50 < puVar47) {
                          puVar50 = (ulong *)((long)puVar50 +
                                             (ulong)((byte)*puVar34 == (byte)*puVar50));
                        }
                        pbVar46 = (byte *)((long)puVar50 - (long)puVar26);
                      }
                      pbVar45 = pbVar45 + (long)pbVar46;
                    }
                    if (pbVar40 <= pbVar45) {
                      puVar26 = puVar5;
                      if (uVar9 < uVar27) {
                        puVar26 = puVar19;
                      }
                      if (local_1d8 < puVar49) {
                        unaff_RBX = (ulong *)0x0;
                        if (puVar26 < puVar35) {
                          puVar50 = (ulong *)(pBVar20 + uVar9);
                          unaff_RBX = (ulong *)0x0;
                          puVar35 = (ulong *)((long)puVar49 + -1);
                          do {
                            puVar50 = (ulong *)((long)puVar50 + -1);
                            if (((byte)*puVar35 != *(byte *)puVar50) ||
                               (unaff_RBX = (ulong *)((long)unaff_RBX + 1), puVar35 <= local_1d8))
                            break;
                            puVar35 = (ulong *)((long)puVar35 + -1);
                          } while (puVar26 < puVar50);
                        }
                      }
                      else {
LAB_00434712:
                        unaff_RBX = (ulong *)0x0;
                      }
LAB_00434714:
                      local_140 = (byte *)((long)unaff_RBX + (long)pbVar45);
                    }
                  }
                  else {
                    puVar26 = (ulong *)(pBVar12 + uVar9);
                    puVar35 = puVar49;
                    if (puVar49 < puVar3) {
                      uVar42 = *puVar49 ^ *puVar26;
                      uVar31 = 0;
                      if (uVar42 != 0) {
                        for (; (uVar42 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                        }
                      }
                      pbVar45 = (byte *)(uVar31 >> 3 & 0x1fffffff);
                      puVar35 = puVar49 + 1;
                      if (*puVar26 == *puVar49) {
                        do {
                          puVar26 = puVar26 + 1;
                          if (puVar3 <= puVar35) goto LAB_00434590;
                          uVar31 = *puVar35;
                          uVar25 = uVar31 ^ *puVar26;
                          uVar42 = 0;
                          if (uVar25 != 0) {
                            for (; (uVar25 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                            }
                          }
                          pbVar45 = (byte *)((long)puVar35 +
                                            ((uVar42 >> 3 & 0x1fffffff) - (long)puVar49));
                          puVar35 = puVar35 + 1;
                        } while (*puVar26 == uVar31);
                      }
                    }
                    else {
LAB_00434590:
                      if ((puVar35 < (ulong *)((long)puVar30 - 3U)) &&
                         ((int)*puVar26 == (int)*puVar35)) {
                        puVar35 = (ulong *)((long)puVar35 + 4);
                        puVar26 = (ulong *)((long)puVar26 + 4);
                      }
                      if ((puVar35 < (ulong *)((long)puVar30 + -1)) &&
                         ((short)*puVar26 == (short)*puVar35)) {
                        puVar35 = (ulong *)((long)puVar35 + 2);
                        puVar26 = (ulong *)((long)puVar26 + 2);
                      }
                      if (puVar35 < puVar47) {
                        puVar35 = (ulong *)((long)puVar35 +
                                           (ulong)((byte)*puVar26 == (byte)*puVar35));
                      }
                      pbVar45 = (byte *)((long)puVar35 - (long)puVar49);
                    }
                    if (pbVar40 <= pbVar45) {
                      if (puVar49 <= local_1d8) goto LAB_00434712;
                      unaff_RBX = (ulong *)0x0;
                      if (uVar27 < uVar9) {
                        unaff_RBX = (ulong *)0x0;
                        puVar26 = (ulong *)((long)puVar49 + -1);
                        puVar35 = (ulong *)(pBVar12 + ((ulong)uVar9 - 1));
                        do {
                          if (((byte)*puVar26 != (byte)*puVar35) ||
                             (unaff_RBX = (ulong *)((long)unaff_RBX + 1), puVar26 <= local_1d8))
                          break;
                          puVar26 = (ulong *)((long)puVar26 + -1);
                          bVar37 = puVar5 < puVar35;
                          puVar35 = (ulong *)((long)puVar35 + -1);
                        } while (bVar37);
                      }
                      goto LAB_00434714;
                    }
                  }
                  if ((pbVar40 <= pbVar45) && (local_f0 < local_140)) {
                    local_158 = plVar32;
                    local_110 = pbVar45;
                    local_f8 = unaff_RBX;
                    local_f0 = local_140;
                  }
                }
              }
              plVar32 = plVar32 + 1;
            } while (plVar32 < plVar13);
            if (local_158 == (ldmEntry_t *)0x0) {
              ZSTD_ldm_makeEntryAndInsertByTag(ldmState,uVar48,hBits,UVar24,*params);
              puVar35 = (ulong *)((long)puVar49 + 1);
              bVar37 = false;
            }
            else {
              puVar35 = (ulong *)((long)puVar49 - (long)local_f8);
              sVar15 = sequences->size;
              bVar37 = true;
              if (sVar15 != sequences->capacity) {
                prVar16 = sequences->seq;
                UVar10 = local_158->offset;
                prVar16[sVar15].litLength = (int)puVar35 - (int)local_1d8;
                prVar16[sVar15].matchLength = (int)local_f8 + (int)local_110;
                prVar16[sVar15].offset = UVar24 - UVar10;
                sequences->size = sVar15 + 1;
                ZSTD_ldm_makeEntryAndInsertByTag(ldmState,uVar48,hBits,UVar24,*params);
                puVar35 = (ulong *)(local_110 + (long)puVar49);
                bVar37 = false;
                local_1d8 = puVar35;
                if (puVar35 <= puVar36) {
                  uVar17 = params->minMatchLength;
                  ldmParams = *params;
                  if (1 < (long)local_110) {
                    local_110 = local_110 + -1;
                    UVar24 = (1 - iVar28) + (int)puVar49;
                    do {
                      uVar48 = (uVar48 - ((ulong)(byte)*puVar49 + 10) * ldmState->hashPower) *
                               -0x30e44323485a9b9d +
                               (ulong)*(byte *)((long)puVar49 + (ulong)(uVar17 - 1) + 1) + 10;
                      ZSTD_ldm_makeEntryAndInsertByTag(ldmState,uVar48,hBits,UVar24,ldmParams);
                      puVar49 = (ulong *)((long)puVar49 + 1);
                      UVar24 = UVar24 + 1;
                      local_110 = local_110 + -1;
                    } while (local_110 != (byte *)0x0);
                  }
                  puVar49 = (ulong *)((long)puVar35 - 1);
                  bVar37 = false;
                }
              }
            }
          }
          else {
            puVar35 = (ulong *)((long)puVar49 + 1);
            bVar37 = false;
          }
          if (bVar37) {
            uVar48 = 0xffffffffffffffba;
            goto LAB_004340ba;
          }
          puVar26 = puVar49;
          puVar49 = puVar35;
        } while (puVar35 <= puVar36);
      }
      uVar48 = (long)puVar47 - (long)local_1d8;
LAB_004340ba:
      uVar31 = uVar48;
      if (uVar48 < 0xffffffffffffff89) {
        uVar31 = local_e0;
        if (uVar11 < sequences->size) {
          pUVar2 = &sequences->seq[uVar11].litLength;
          *pUVar2 = *pUVar2 + (int)local_160;
          local_160 = uVar48;
        }
        else {
          local_160 = local_160 + ((long)puVar47 - (long)puVar4);
        }
      }
      local_e0 = uVar31;
      if (0xffffffffffffff88 < uVar48) {
        return local_e0;
      }
      lVar43 = lVar43 + 1;
    } while (lVar43 != lVar29);
  }
  return 0;
}

Assistant:

size_t ZSTD_ldm_generateSequences(
        ldmState_t* ldmState, rawSeqStore_t* sequences,
        ldmParams_t const* params, void const* src, size_t srcSize)
{
    U32 const maxDist = 1U << params->windowLog;
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    size_t const kMaxChunkSize = 1 << 20;
    size_t const nbChunks = (srcSize / kMaxChunkSize) + ((srcSize % kMaxChunkSize) != 0);
    size_t chunk;
    size_t leftoverSize = 0;

    assert(ZSTD_CHUNKSIZE_MAX >= kMaxChunkSize);
    /* Check that ZSTD_window_update() has been called for this chunk prior
     * to passing it to this function.
     */
    assert(ldmState->window.nextSrc >= (BYTE const*)src + srcSize);
    /* The input could be very large (in zstdmt), so it must be broken up into
     * chunks to enforce the maximmum distance and handle overflow correction.
     */
    assert(sequences->pos <= sequences->size);
    assert(sequences->size <= sequences->capacity);
    for (chunk = 0; chunk < nbChunks && sequences->size < sequences->capacity; ++chunk) {
        BYTE const* const chunkStart = istart + chunk * kMaxChunkSize;
        size_t const remaining = (size_t)(iend - chunkStart);
        BYTE const *const chunkEnd =
            (remaining < kMaxChunkSize) ? iend : chunkStart + kMaxChunkSize;
        size_t const chunkSize = chunkEnd - chunkStart;
        size_t newLeftoverSize;
        size_t const prevSize = sequences->size;

        assert(chunkStart < iend);
        /* 1. Perform overflow correction if necessary. */
        if (ZSTD_window_needOverflowCorrection(ldmState->window, chunkEnd)) {
            U32 const ldmHSize = 1U << params->hashLog;
            U32 const correction = ZSTD_window_correctOverflow(
                &ldmState->window, /* cycleLog */ 0, maxDist, src);
            ZSTD_ldm_reduceTable(ldmState->hashTable, ldmHSize, correction);
        }
        /* 2. We enforce the maximum offset allowed.
         *
         * kMaxChunkSize should be small enough that we don't lose too much of
         * the window through early invalidation.
         * TODO: * Test the chunk size.
         *       * Try invalidation after the sequence generation and test the
         *         the offset against maxDist directly.
         */
        ZSTD_window_enforceMaxDist(&ldmState->window, chunkEnd, maxDist, NULL, NULL);
        /* 3. Generate the sequences for the chunk, and get newLeftoverSize. */
        newLeftoverSize = ZSTD_ldm_generateSequences_internal(
            ldmState, sequences, params, chunkStart, chunkSize);
        if (ZSTD_isError(newLeftoverSize))
            return newLeftoverSize;
        /* 4. We add the leftover literals from previous iterations to the first
         *    newly generated sequence, or add the `newLeftoverSize` if none are
         *    generated.
         */
        /* Prepend the leftover literals from the last call */
        if (prevSize < sequences->size) {
            sequences->seq[prevSize].litLength += (U32)leftoverSize;
            leftoverSize = newLeftoverSize;
        } else {
            assert(newLeftoverSize == chunkSize);
            leftoverSize += chunkSize;
        }
    }
    return 0;
}